

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *p_data,float v_speed,void *p_min,
                      void *p_max,char *format,float power)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  ImGuiWindow *window_00;
  ImGuiDataTypeInfo *pIVar8;
  ImVec2 *text_size_if_known;
  void *in_RCX;
  ImGuiID in_EDX;
  int in_ESI;
  ImGuiDragFlags in_EDI;
  long in_R8;
  char *in_R9;
  ImGuiDataType in_XMM0_Da;
  float fVar9;
  float in_XMM1_Da;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImU32 frame_col;
  bool double_clicked;
  bool clicked;
  bool focus_requested;
  bool temp_input_start;
  bool temp_input_is_active;
  bool hovered;
  ImRect total_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe48;
  float text_baseline_y;
  void *p_data_00;
  ImRect *in_stack_fffffffffffffe50;
  ImRect *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  undefined1 *puVar10;
  ImGuiWindow *in_stack_fffffffffffffe68;
  ImGuiWindow *in_stack_fffffffffffffe70;
  ImGuiWindow *in_stack_fffffffffffffe78;
  ImVec2 *pIVar11;
  undefined8 in_stack_fffffffffffffe80;
  ImGuiID id_00;
  undefined4 uVar12;
  undefined2 in_stack_fffffffffffffe8c;
  byte in_stack_fffffffffffffe8e;
  byte in_stack_fffffffffffffe8f;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffe98;
  ImVec2 pos;
  float rounding;
  ImRect *clip_rect;
  ImVec2 p_max_00;
  ImVec2 p_min_00;
  uint in_stack_fffffffffffffecc;
  uint uVar13;
  ImVec2 in_stack_fffffffffffffed0;
  ImVec2 local_128;
  void *in_stack_fffffffffffffee0;
  ImVec2 in_stack_fffffffffffffee8;
  ImGuiNavHighlightFlags in_stack_fffffffffffffef8;
  ImGuiID in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImRect local_a0;
  ImVec2 local_90;
  ImVec2 local_88;
  ImRect local_80;
  ImVec2 local_70;
  float local_68;
  ImGuiID local_64;
  ImGuiStyle *local_60;
  ImGuiContext *pIVar14;
  float power_00;
  undefined4 in_stack_ffffffffffffffb8;
  float v_speed_00;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  window_00 = GetCurrentWindow();
  if ((window_00->SkipItems & 1U) == 0) {
    if ((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) {
      uVar13 = in_stack_fffffffffffffecc & 0xffffff;
      if (in_RCX != (void *)0x0) {
        uVar13 = CONCAT13(in_R8 != 0,(int3)in_stack_fffffffffffffecc);
      }
      in_stack_fffffffffffffecc = uVar13;
      if ((char)(uVar13 >> 0x18) == '\0') {
        __assert_fail("p_min != __null && p_max != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                      ,0x858,
                      "bool ImGui::DragScalar(const char *, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                     );
      }
    }
    local_60 = &GImGui->Style;
    pos.x = 0.0;
    pos.y = 0.0;
    pIVar14 = GImGui;
    local_64 = ImGuiWindow::GetID(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                                  in_stack_fffffffffffffe60);
    v_speed_00 = (float)((ulong)in_R8 >> 0x20);
    local_68 = CalcItemWidth();
    local_70 = CalcTextSize((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                            SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe68,0));
    clip_rect = (ImRect *)&window_00->DC;
    fVar9 = (local_60->FramePadding).y;
    pIVar11 = &local_90;
    ImVec2::ImVec2(pIVar11,local_68,fVar9 + fVar9 + local_70.y);
    local_88 = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x1c61a2);
    ImRect::ImRect(&local_80,&clip_rect->Min,&local_88);
    p_max_00 = (ImVec2)&local_80;
    p_min_00 = (ImVec2)&local_80.Max;
    if (local_70.x <= 0.0) {
      fVar9 = 0.0;
    }
    else {
      fVar9 = (local_60->ItemInnerSpacing).x + local_70.x;
    }
    this = &local_b0;
    ImVec2::ImVec2(this,fVar9,0.0);
    local_a8 = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x1c6247);
    text_baseline_y = (float)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    ImRect::ImRect(&local_a0,(ImVec2 *)p_max_00,&local_a8);
    ItemSize(in_stack_fffffffffffffe50,text_baseline_y);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe78,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe68);
    if (bVar1) {
      if (in_R9 == (char *)0x0) {
        pIVar8 = DataTypeGetInfo(0);
        in_R9 = pIVar8->PrintFmt;
      }
      else if ((in_ESI == 4) && (iVar7 = strcmp(in_R9,"%d"), iVar7 != 0)) {
        in_R9 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe58);
      }
      bVar2 = ItemHoverable(in_stack_fffffffffffffe58,
                            (ImGuiID)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      bVar3 = TempInputIsActive(local_64);
      bVar1 = false;
      if (!bVar3) {
        bVar4 = FocusableItemRegister
                          (in_stack_fffffffffffffe68,
                           (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        in_stack_fffffffffffffe8f = 0;
        if (bVar2) {
          in_stack_fffffffffffffe8f = (pIVar14->IO).MouseClicked[0];
        }
        bVar5 = in_stack_fffffffffffffe8f & 1;
        in_stack_fffffffffffffe8e = 0;
        if (bVar2) {
          in_stack_fffffffffffffe8e = (pIVar14->IO).MouseDoubleClicked[0];
        }
        bVar6 = in_stack_fffffffffffffe8e & 1;
        if ((((bVar4) || (bVar5 != 0)) || (bVar6 != 0)) ||
           ((pIVar14->NavActivateId == local_64 || (pIVar14->NavInputId == local_64)))) {
          SetActiveID(local_64,window_00);
          SetFocusID(id_00,in_stack_fffffffffffffe78);
          FocusWindow(in_stack_fffffffffffffe70);
          pIVar14->ActiveIdUsingNavDirMask = 3;
          if ((((bVar4) || ((bVar5 != 0 && (((pIVar14->IO).KeyCtrl & 1U) != 0)))) || (bVar6 != 0))
             || (pIVar14->NavInputId == local_64)) {
            bVar1 = true;
            FocusableItemUnregister(window_00);
          }
        }
      }
      if ((bVar3) || (bVar1)) {
        local_1 = TempInputScalar((ImRect *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                                  (char *)p_min_00,(ImGuiDataType)p_max_00.y,clip_rect,
                                  (char *)pIVar11,in_stack_fffffffffffffee0,
                                  (void *)in_stack_fffffffffffffee8);
      }
      else {
        if (pIVar14->ActiveId == local_64) {
          uVar12 = 9;
        }
        else {
          uVar12 = 7;
          if (pIVar14->HoveredId == local_64) {
            uVar12 = 8;
          }
        }
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    SUB84(in_stack_fffffffffffffe60,0));
        power_00 = (float)((ulong)pIVar14 >> 0x20);
        rounding = (float)((ulong)pIVar11 >> 0x20);
        RenderNavHighlight(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                           in_stack_fffffffffffffef8);
        RenderFrame(p_min_00,p_max_00,(ImU32)((ulong)clip_rect >> 0x20),
                    SUB81((ulong)clip_rect >> 0x18,0),rounding);
        p_data_00 = (void *)((ulong)(uint)text_baseline_y << 0x20);
        local_1 = DragBehavior(in_EDX,in_XMM0_Da,in_RCX,v_speed_00,in_R9,
                               (void *)CONCAT44(in_XMM1_Da,in_stack_ffffffffffffffb8),
                               (char *)window_00,power_00,in_EDI);
        if (local_1) {
          MarkItemEdited((ImGuiID)((ulong)in_stack_fffffffffffffe50 >> 0x20));
        }
        puVar10 = &stack0xfffffffffffffee8;
        iVar7 = DataTypeFormatString
                          ((char *)in_stack_fffffffffffffe58,
                           (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                           (ImGuiDataType)in_stack_fffffffffffffe50,p_data_00,(char *)0x1c669f);
        text_size_if_known = (ImVec2 *)(puVar10 + iVar7);
        pIVar11 = (ImVec2 *)&stack0xfffffffffffffee8;
        ImVec2::ImVec2(&local_128,0.5,0.5);
        RenderTextClipped((ImVec2 *)pos,(ImVec2 *)CONCAT44(fVar9,in_stack_fffffffffffffe98),
                          (char *)this,
                          (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                           CONCAT16(in_stack_fffffffffffffe8e,
                                                    CONCAT24(in_stack_fffffffffffffe8c,uVar12))),
                          text_size_if_known,pIVar11,clip_rect);
        if (0.0 < local_70.x) {
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffed0,
                         local_80.Max.x + (local_60->ItemInnerSpacing).x,
                         local_80.Min.y + (local_60->FramePadding).y);
          RenderText(pos,(char *)CONCAT44(fVar9,in_stack_fffffffffffffe98),(char *)this,
                     (bool)in_stack_fffffffffffffe8f);
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* p_data, float v_speed, const void* p_min, const void* p_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (power != 1.0f)
        IM_ASSERT(p_min != NULL && p_max != NULL); // When using a power curve the drag needs to have known bounds

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Drag turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    bool temp_input_is_active = TempInputIsActive(id);
    bool temp_input_start = false;
    if (!temp_input_is_active)
    {
        const bool focus_requested = FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        const bool double_clicked = (hovered && g.IO.MouseDoubleClicked[0]);
        if (focus_requested || clicked || double_clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (focus_requested || (clicked && g.IO.KeyCtrl) || double_clicked || g.NavInputId == id)
            {
                temp_input_start = true;
                FocusableItemUnregister(window);
            }
        }
    }

    // Our current specs do NOT clamp when using CTRL+Click manual input, but we should eventually add a flag for that..
    if (temp_input_is_active || temp_input_start)
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format);// , p_min, p_max);

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Drag behavior
    const bool value_changed = DragBehavior(id, data_type, p_data, v_speed, p_min, p_max, format, power, ImGuiDragFlags_None);
    if (value_changed)
        MarkItemEdited(id);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}